

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

int __thiscall
google::protobuf::internal::ExtensionSet::Extension::MessageSetItemByteSize
          (Extension *this,int number)

{
  int iVar1;
  int iVar2;
  uint32 value;
  
  if ((this->type == '\v') && (this->is_repeated != true)) {
    iVar1 = 0;
    if ((this->field_0xa & 1) == 0) {
      iVar2 = io::CodedOutputStream::VarintSize32(number);
      value = (**(code **)(((this->field_0).repeated_int32_value)->elements_ +
                          (ulong)((this->field_0xa & 0x10) == 0) * 2 + 0x10))();
      iVar1 = io::CodedOutputStream::VarintSize32(value);
      iVar1 = iVar2 + 4 + value + iVar1;
    }
    return iVar1;
  }
  iVar1 = ByteSize(this,number);
  return iVar1;
}

Assistant:

int ExtensionSet::Extension::MessageSetItemByteSize(int number) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but compute the byte size for it the
    // normal way.
    return ByteSize(number);
  }

  if (is_cleared) return 0;

  int our_size = WireFormatLite::kMessageSetItemTagsSize;

  // type_id
  our_size += io::CodedOutputStream::VarintSize32(number);

  // message
  int message_size = 0;
  if (is_lazy) {
    message_size = lazymessage_value->ByteSize();
  } else {
    message_size = message_value->ByteSize();
  }

  our_size += io::CodedOutputStream::VarintSize32(message_size);
  our_size += message_size;

  return our_size;
}